

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  size_t sVar1;
  int local_1c;
  size_t sStack_18;
  int s;
  size_t total;
  ShardedLRUCache *this_local;
  
  sStack_18 = 0;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    sVar1 = LRUCache::TotalCharge(this->shard_ + local_1c);
    sStack_18 = sVar1 + sStack_18;
  }
  return sStack_18;
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }